

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

bool Memory::DefaultRecyclerCollectionWrapper::IsCollectionDisabled(Recycler *recycler)

{
  bool bVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  undefined8 *in_FS_OFFSET;
  
  bVar1 = recycler->isCollectionDisabled;
  if (bVar1 == true) {
    bVar4 = Recycler::IsHeapEnumInProgress(recycler);
    if ((!bVar4) || (recycler->allowAllocationDuringHeapEnum == false)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x37,
                         "(recycler->IsHeapEnumInProgress() && recycler->AllowAllocationDuringHeapEnum())"
                         ,
                         "recycler->IsHeapEnumInProgress() && recycler->AllowAllocationDuringHeapEnum()"
                        );
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar2 = 0;
    }
  }
  return bVar1;
}

Assistant:

inline bool
DefaultRecyclerCollectionWrapper::IsCollectionDisabled(Recycler * recycler)
{
    // GC shouldn't be triggered during heap enum, unless we missed a case where it allocate memory (which
    // shouldn't happen during heap enum) or for the case we explicitly allow allocation
    // REVIEW: isHeapEnumInProgress should have been a collection state and checked before to avoid a check here.
    // Collection will be disabled in VarDispEx because it could be called from projection re-entrance as ASTA allows
    // QI/AddRef/Release to come back.
    bool collectionDisabled = recycler->IsCollectionDisabled();
#if DBG
    if (collectionDisabled)
    {
        // disabled collection should only happen if we allowed allocation during heap enum
        Assert(recycler->IsHeapEnumInProgress() && recycler->AllowAllocationDuringHeapEnum());
    }
#endif
    return collectionDisabled;
}